

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O3

String * __thiscall
Rml::Parse::VariableOrFunctionName_abi_cxx11_
          (String *__return_storage_ptr__,Parse *this,DataParser *parser,
          bool *out_valid_function_name)

{
  byte bVar1;
  String *pSVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this[0x40] == (Parse)0x0) {
    pSVar2 = (String *)
             CONCAT71((int7)((ulong)*(long *)this >> 8),
                      *(undefined1 *)(*(long *)this + *(long *)(this + 0x38)));
  }
  else {
    pSVar2 = (String *)0x0;
  }
  bVar3 = true;
  do {
    bVar1 = (byte)pSVar2;
    bVar4 = (bVar1 & 0xdf) + 0xbf;
    if (bVar3) {
      if (0x19 < bVar4) goto LAB_001f20b1;
    }
    else if ((((0x19 < bVar4) && (bVar1 != 0x2e)) && (bVar1 != 0x5f)) && (9 < (byte)(bVar1 - 0x30)))
    {
LAB_001f20b1:
      if (parser != (DataParser *)0x0) {
        pSVar2 = (String *)
                 ::std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x2d0813,0);
        *(bool *)&(parser->expression)._M_dataplus._M_p = pSVar2 == (String *)0xffffffffffffffff;
      }
      return pSVar2;
    }
    ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    uVar5 = *(long *)(this + 0x38) + 1;
    *(ulong *)(this + 0x38) = uVar5;
    if (uVar5 < *(ulong *)(this + 8)) {
      pSVar2 = (String *)0x0;
      bVar3 = false;
      if (((byte)this[0x40] & 1) == 0) {
        pSVar2 = (String *)
                 CONCAT71((int7)((ulong)*(long *)this >> 8),*(undefined1 *)(*(long *)this + uVar5));
        bVar3 = false;
      }
    }
    else {
      this[0x40] = (Parse)0x1;
      pSVar2 = (String *)0x0;
      bVar3 = false;
    }
  } while( true );
}

Assistant:

static String VariableOrFunctionName(DataParser& parser, bool* out_valid_function_name)
	{
		String name;
		bool is_first_character = true;
		char c = parser.Look();

		while (IsVariableCharacter(c, is_first_character))
		{
			name += c;
			c = parser.Next();
			is_first_character = false;
		}

		if (out_valid_function_name)
			*out_valid_function_name = (name.find_first_of(". ") == String::npos);

		return name;
	}